

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitmap.cpp
# Opt level: O3

void __thiscall
FBitmap::CopyPixelData
          (FBitmap *this,int originx,int originy,BYTE *patch,int srcwidth,int srcheight,int step_x,
          int step_y,int rotate,PalEntry *palette,FCopyInfo *inf)

{
  BYTE *pBVar1;
  FCopyInfo *inf_00;
  bool bVar2;
  long lVar3;
  ulong uVar4;
  PalEntry *pout;
  PalEntry *pin;
  int iVar5;
  long lVar6;
  long lVar7;
  int srcheight_local;
  int srcwidth_local;
  int originy_local;
  int originx_local;
  BYTE *patch_local;
  PalEntry penew [256];
  
  srcheight_local = srcheight;
  srcwidth_local = srcwidth;
  originy_local = originy;
  originx_local = originx;
  patch_local = patch;
  bVar2 = ClipCopyPixelRect(&this->ClipRect,&originx_local,&originy_local,&patch_local,
                            &srcwidth_local,&srcheight_local,&step_x,&step_y,rotate);
  inf_00 = inf;
  pin = palette;
  if (bVar2) {
    lVar7 = (long)originx_local;
    iVar5 = this->Pitch;
    lVar6 = (long)iVar5;
    lVar3 = (long)originy_local;
    pBVar1 = this->data;
    uVar4 = 0;
    memset(penew,0,0x400);
    if (inf_00 != (FCopyInfo *)0x0) {
      pout = pin;
      if (inf_00->blend != BLEND_NONE) {
        pout = penew;
        iCopyColors<cPalEntry,cBGRA,bCopy>((BYTE *)pout,(BYTE *)pin,0x100,4,inf_00,'\0','\0','\0');
        iVar5 = this->Pitch;
      }
      uVar4 = (ulong)inf_00->op;
      pin = pout;
    }
    (*copypalettedfuncs[uVar4])
              (pBVar1 + lVar3 * lVar6 + lVar7 * 4,patch_local,srcwidth_local,srcheight_local,iVar5,
               step_x,step_y,rotate,pin,inf_00);
  }
  return;
}

Assistant:

void FBitmap::CopyPixelData(int originx, int originy, const BYTE * patch, int srcwidth, int srcheight, 
										int step_x, int step_y, int rotate, PalEntry * palette, FCopyInfo *inf)
{
	if (ClipCopyPixelRect(&ClipRect, originx, originy, patch, srcwidth, srcheight, step_x, step_y, rotate))
	{
		BYTE *buffer = data + 4*originx + Pitch*originy;
		PalEntry penew[256];

		memset(penew, 0, sizeof(penew));
		if (inf && inf->blend)
		{
			iCopyColors<cPalEntry, cBGRA, bCopy>((BYTE*)penew, (const BYTE*)palette, 256, 4, inf, 0, 0, 0);
			palette = penew;
		}

		copypalettedfuncs[inf==NULL? OP_COPY : inf->op](buffer, patch, srcwidth, srcheight, Pitch, 
														step_x, step_y, rotate, palette, inf);
	}
}